

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O1

void __thiscall
duckdb::Index::Index
          (Index *this,vector<unsigned_long,_true> *column_ids,TableIOManager *table_io_manager,
          AttachedDatabase *db)

{
  pointer puVar1;
  __hashtable *__h;
  pointer puVar2;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  this->_vptr_Index = (_func_int **)&PTR__Index_0199f7f8;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->column_ids,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  (this->column_id_set)._M_h._M_buckets = &(this->column_id_set)._M_h._M_single_bucket;
  (this->column_id_set)._M_h._M_bucket_count = 1;
  (this->column_id_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_id_set)._M_h._M_element_count = 0;
  (this->column_id_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_id_set)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_id_set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->table_io_manager = table_io_manager;
  this->db = db;
  puVar1 = (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->column_id_set;
  for (puVar2 = (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->column_id_set,puVar2,&local_38);
  }
  return;
}

Assistant:

Index::Index(const vector<column_t> &column_ids, TableIOManager &table_io_manager, AttachedDatabase &db)

    : column_ids(column_ids), table_io_manager(table_io_manager), db(db) {

	if (!Radix::IsLittleEndian()) {
		throw NotImplementedException("indexes are not supported on big endian architectures");
	}
	// create the column id set
	column_id_set.insert(column_ids.begin(), column_ids.end());
}